

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O0

void __thiscall PartVolumeButton::toggleSoloPart(PartVolumeButton *this,bool enabled)

{
  int local_18;
  int i;
  bool enabled_local;
  PartVolumeButton *this_local;
  
  for (local_18 = 0; local_18 < 9; local_18 = local_18 + 1) {
    if ((enabled) && (local_18 != this->partNum)) {
      mutePart(this->monitor->partVolumeButton[local_18]);
    }
    else {
      unmutePart(this->monitor->partVolumeButton[local_18]);
    }
  }
  return;
}

Assistant:

void PartVolumeButton::toggleSoloPart(bool enabled) {
	for (int i = 0; i < 9; i++) {
		if (enabled && i != partNum) {
			monitor.partVolumeButton[i]->mutePart();
		} else {
			monitor.partVolumeButton[i]->unmutePart();
		}
	}
}